

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O0

void __thiscall amrex::MLEBABecLap::update(MLEBABecLap *this)

{
  bool bVar1;
  iterator pvVar2;
  LinOpBCType *pLVar3;
  iterator __last;
  LinOpBCType *pLVar4;
  int *piVar5;
  uint *puVar6;
  size_type in_RDI;
  Real RVar7;
  Real RVar8;
  Real amax;
  Real asum;
  int alev;
  LinOpBCType *ithi;
  LinOpBCType *itlo;
  bool in_stack_000000d3;
  int in_stack_000000d4;
  MultiFab *in_stack_000000d8;
  undefined1 in_stack_000002ae;
  undefined1 in_stack_000002af;
  int in_stack_000002b0;
  int in_stack_000002b4;
  MultiFab *in_stack_000002b8;
  size_type in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  LinOpBCType *in_stack_ffffffffffffffa8;
  LinOpBCType *in_stack_ffffffffffffffb0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  int local_30;
  
  bVar1 = MLCellABecLap::needsUpdate((MLCellABecLap *)0x1797348);
  if (bVar1) {
    MLCellABecLap::update
              ((MLCellABecLap *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  averageDownCoeffs((MLEBABecLap *)itlo);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1797373);
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_ffffffffffffffc0,in_RDI,(value_type *)in_stack_ffffffffffffffb0);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
  pvVar2 = std::array<amrex::LinOpBCType,_3UL>::begin((array<amrex::LinOpBCType,_3UL> *)0x17973b5);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
  std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x17973d7);
  pLVar3 = std::find<amrex::LinOpBCType*,amrex::LinOpBCType>
                     (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,pvVar2);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
  __last = std::array<amrex::LinOpBCType,_3UL>::begin((array<amrex::LinOpBCType,_3UL> *)0x1797413);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
  std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x1797435);
  pLVar4 = std::find<amrex::LinOpBCType*,amrex::LinOpBCType>
                     (in_stack_ffffffffffffffb0,__last,pvVar2);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
  pvVar2 = std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x179747b);
  if (pLVar3 == pvVar2) {
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
    pvVar2 = std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x17974b3);
    if ((pLVar4 == pvVar2) && (bVar1 = isEBDirichlet((MLEBABecLap *)0x17974ce), !bVar1)) {
      for (local_30 = 0; local_30 < *(int *)(in_RDI + 0x34); local_30 = local_30 + 1) {
        piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88);
        if (*piVar5 != 0) {
          if ((*(double *)(in_RDI + 0x330) != 0.0) || (NAN(*(double *)(in_RDI + 0x330)))) {
            Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
            ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88);
            std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::back
                      ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
            RVar7 = MultiFab::sum(in_stack_000000d8,in_stack_000000d4,in_stack_000000d3);
            Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
            ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88);
            std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::back
                      ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
            RVar8 = MultiFab::norm0(in_stack_000002b8,in_stack_000002b4,in_stack_000002b0,
                                    (bool)in_stack_000002af,(bool)in_stack_000002ae);
            bVar1 = RVar7 <= RVar8 * 1e-12;
            in_stack_ffffffffffffff94 = (uint)bVar1;
            puVar6 = (uint *)Vector<int,_std::allocator<int>_>::operator[]
                                       ((Vector<int,_std::allocator<int>_> *)
                                        (ulong)CONCAT14(bVar1,in_stack_ffffffffffffff90),
                                        in_stack_ffffffffffffff88);
            *puVar6 = in_stack_ffffffffffffff94;
          }
          else {
            piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                               ((Vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                in_stack_ffffffffffffff88);
            *piVar5 = 1;
          }
        }
      }
    }
  }
  *(undefined1 *)(in_RDI + 0x324) = 0;
  return;
}

Assistant:

void
MLEBABecLap::update ()
{
    if (MLCellABecLap::needsUpdate()) MLCellABecLap::update();

    averageDownCoeffs();

    m_is_singular.clear();
    m_is_singular.resize(m_num_amr_levels, false);
    auto itlo = std::find(m_lobc[0].begin(), m_lobc[0].end(), BCType::Dirichlet);
    auto ithi = std::find(m_hibc[0].begin(), m_hibc[0].end(), BCType::Dirichlet);
    if (itlo == m_lobc[0].end() && ithi == m_hibc[0].end() && !isEBDirichlet())
    {  // No Dirichlet
        for (int alev = 0; alev < m_num_amr_levels; ++alev)
        {
            if (m_domain_covered[alev])
            {
                if (m_a_scalar == 0.0)
                {
                    m_is_singular[alev] = true;
                }
                else
                {
                    Real asum = m_a_coeffs[alev].back().sum();
                    Real amax = m_a_coeffs[alev].back().norm0();
                    m_is_singular[alev] = (asum <= amax * 1.e-12);
                }
            }
        }
    }

    m_needs_update = false;
}